

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<double,int,double,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pdVar2 = (double *)result->data;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    dVar5 = *(double *)left->data;
    dVar4 = (double)*(int *)right->data;
    if (*(int *)right->data < 0) {
      dVar4 = pow(10.0,-dVar4);
      dVar3 = round(dVar5 / dVar4);
      dVar3 = dVar3 * dVar4;
      dVar5 = 0.0;
    }
    else {
      dVar4 = pow(10.0,dVar4);
      dVar3 = round(dVar5 * dVar4);
      dVar3 = dVar3 / dVar4;
    }
    if ((ulong)ABS(dVar3) < 0x7ff0000000000000) {
      dVar5 = dVar3;
    }
    *pdVar2 = dVar5;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}